

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
MapLoader::validateCountryLine
          (MapLoader *this,int *countryCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryID,int *continentCount,bool verbose)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  bool verbose_local;
  int *countryID_local;
  bool *validMap_local;
  int *lineCount_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lineWords_local;
  int *countryCount_local;
  MapLoader *this_local;
  
  *countryCount = *countryCount + 1;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(lineWords);
  if (sVar2 < 3) {
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
      std::operator<<(poVar3,
                      " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(lineWords);
    if ((3 < sVar2) && (verbose)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
      std::operator<<(poVar3,
                      " - [WARNING] : a line in  the countries declaration had extra tokens.\n");
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](lineWords,0);
    iVar1 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
    if (iVar1 == *countryID) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](lineWords,2);
      iVar1 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
      if (iVar1 <= *continentCount) {
        *countryID = *countryID + 1;
        return true;
      }
    }
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*lineCount);
      std::operator<<(poVar3," - [ERROR] : a country or continent ID did was invalid.\n");
    }
    *validMap = false;
  }
  return false;
}

Assistant:

bool MapLoader::validateCountryLine(int* countryCount, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap,
                               int* countryID, const int* continentCount,bool verbose) {
    (*countryCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 3) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        if (lineWords->size() > 3 && verbose)
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the countries declaration had extra tokens.\n";
        //check country id matches with order and that it references a valid continent
        if (std::stoi((*lineWords)[0]) == *countryID && std::stoi((*lineWords)[2]) <= *continentCount) {
            (*countryID)++;
            return true;
        } else {
            if(verbose){
                std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
            }
            *validMap = false;
            return false;
        }
    }
}